

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::Decode(TSPI_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *stream_00;
  int iVar2;
  byte local_57;
  char local_56 [7];
  KUINT8 i;
  KOCTET tmp;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  TSPI_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0;
  if ((local_19 & 1) != 0) {
    iVar2 = 0xc;
  }
  if (0x18 < (uint)KVar1 + iVar2) {
    std::vector<char,_std::allocator<char>_>::clear(&this->m_vSSD);
    LE_Header::Decode(&this->super_LE_Header,pKStack_18,(bool)(local_19 & 1));
    stream_00 = KDataStream::operator>>(pKStack_18,&(this->m_TSPIFlagUnion).m_ui8Flag);
    DATA_TYPE::operator>>(stream_00,&(this->m_Loc).super_DataTypeBase);
    if (((this->m_TSPIFlagUnion).m_ui8Flag & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_LinVel).super_DataTypeBase);
    }
    if (((this->m_TSPIFlagUnion).m_ui8Flag >> 1 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_Ori).super_DataTypeBase);
    }
    if (((this->m_TSPIFlagUnion).m_ui8Flag >> 2 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_PosErr).super_DataTypeBase);
    }
    if (((this->m_TSPIFlagUnion).m_ui8Flag >> 3 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_OriErr).super_DataTypeBase);
    }
    if (((this->m_TSPIFlagUnion).m_ui8Flag >> 4 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_DeadReckoningParameter).super_DataTypeBase);
    }
    if (((this->m_TSPIFlagUnion).m_ui8Flag >> 5 & 1) != 0) {
      DATA_TYPE::operator>>(pKStack_18,&(this->m_MeasureSpd).super_DataTypeBase);
    }
    if (((this->m_TSPIFlagUnion).m_ui8Flag >> 6 & 1) != 0) {
      KDataStream::operator>>(pKStack_18,&this->m_ui8SSDLen);
      for (local_57 = 0; local_57 < this->m_ui8SSDLen; local_57 = local_57 + 1) {
        KDataStream::operator>>(pKStack_18,local_56);
        std::vector<char,_std::allocator<char>_>::push_back(&this->m_vSSD,local_56);
      }
    }
    return;
  }
  local_56[1] = 1;
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
  KException::KException(this_00,&local_40,2);
  local_56[1] = 0;
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void TSPI_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TSPI_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSSD.clear();

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_TSPIFlagUnion.m_ui8Flag
           >> KDIS_STREAM m_Loc;

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        stream >> KDIS_STREAM m_LinVel;
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        stream >> KDIS_STREAM m_Ori;
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        stream >> KDIS_STREAM m_PosErr;
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        stream >> KDIS_STREAM m_OriErr;
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        stream >> KDIS_STREAM m_DeadReckoningParameter;
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        stream >> KDIS_STREAM m_MeasureSpd;
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        stream >> m_ui8SSDLen;

        // Decode System Specific Data
        KOCTET tmp;
        for( KUINT8 i = 0; i < m_ui8SSDLen; ++i )
        {
            stream >> tmp;
            m_vSSD.push_back( tmp );
        }
    }
}